

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O0

char * get_request_headers(MAP_HANDLE headers)

{
  undefined1 auVar1 [16];
  MAP_RESULT MVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  size_t local_a0;
  size_t local_98;
  ulong local_90;
  size_t local_88;
  long local_80;
  size_t value_length;
  size_t key_length;
  size_t position;
  LOGGER_LOG l_1;
  size_t malloc_size;
  size_t i;
  size_t length;
  LOGGER_LOG l;
  size_t count;
  char **values;
  char **keys;
  char *result;
  MAP_HANDLE headers_local;
  
  result = (char *)headers;
  MVar2 = Map_GetInternals(headers,&values,(char ***)&count,(size_t *)&l);
  if (MVar2 == MAP_OK) {
    i = 0;
    for (malloc_size = 0; malloc_size < l; malloc_size = malloc_size + 1) {
      sVar4 = strlen(values[malloc_size]);
      sVar5 = strlen(*(char **)(count + malloc_size * 8));
      i = sVar4 + sVar5 + 4 + i;
    }
    if (i < 0xfffffffffffffffe) {
      local_80 = i + 1;
    }
    else {
      local_80 = -1;
    }
    if (local_80 == 0) {
      local_88 = 0;
    }
    else {
      if (i < 0xfffffffffffffffe) {
        local_90 = i + 1;
      }
      else {
        local_90 = 0xffffffffffffffff;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_90;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) == 0) {
        local_a0 = 0xffffffffffffffff;
      }
      else {
        if (i < 0xfffffffffffffffe) {
          local_98 = i + 1;
        }
        else {
          local_98 = 0xffffffffffffffff;
        }
        local_a0 = local_98;
      }
      local_88 = local_a0;
    }
    if ((local_88 == 0xffffffffffffffff) || (keys = (char **)malloc(local_88), keys == (char **)0x0)
       ) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                  ,"get_request_headers",0x2cb,1,
                  "Failed allocating string for request headers, size=%zu",local_88);
      }
      keys = (char **)0x0;
    }
    else {
      key_length = 0;
      for (malloc_size = 0; malloc_size < l; malloc_size = malloc_size + 1) {
        sVar4 = strlen(values[malloc_size]);
        sVar5 = strlen(*(char **)(count + malloc_size * 8));
        memcpy((void *)((long)keys + key_length),values[malloc_size],sVar4);
        *(undefined2 *)((long)keys + sVar4 + key_length) =
             *(undefined2 *)HTTP_HEADER_KEY_VALUE_SEPARATOR;
        lVar6 = sVar4 + key_length + 2;
        memcpy((void *)((long)keys + lVar6),*(void **)(count + malloc_size * 8),sVar5);
        lVar6 = sVar5 + lVar6;
        *(undefined2 *)((long)keys + lVar6) = *(undefined2 *)HTTP_HEADER_TERMINATOR;
        key_length = lVar6 + 2;
      }
      *(undefined1 *)((long)keys + key_length) = 0;
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"get_request_headers",0x2b9,1,"Failed getting the request headers");
    }
    keys = (char **)0x0;
  }
  return (char *)keys;
}

Assistant:

static char* get_request_headers(MAP_HANDLE headers)
{
    char* result;
    const char* const* keys;
    const char* const* values;
    size_t count;

    if (Map_GetInternals(headers, &keys, &values, &count) != MAP_OK)
    {
        LogError("Failed getting the request headers");
        result = NULL;
    }
    else
    {
        size_t length = 0;
        size_t i;

        for (i = 0; i < count; i++)
        {
            // 4 = 2 (": ") + 2 ("\r\n")
            length += strlen(keys[i]) + strlen(values[i]) + 4;
        }

        size_t malloc_size = safe_multiply_size_t(safe_add_size_t(length, 1), sizeof(char));
        if (malloc_size == SIZE_MAX ||
            (result = (char*)malloc(malloc_size)) == NULL)
        {
            LogError("Failed allocating string for request headers, size=%zu", malloc_size);
            result = NULL;
        }
        else
        {
            size_t position = 0;

            for (i = 0; i < count; i++)
            {
                size_t key_length = strlen(keys[i]);
                size_t value_length = strlen(values[i]);

                (void)memcpy(result + position, keys[i], key_length);
                position += key_length;
                (void)memcpy(result + position, HTTP_HEADER_KEY_VALUE_SEPARATOR, HTTP_HEADER_KEY_VALUE_SEPARATOR_LENGTH);
                position += HTTP_HEADER_KEY_VALUE_SEPARATOR_LENGTH;
                (void)memcpy(result + position, values[i], value_length);
                position += value_length;
                (void)memcpy(result + position, HTTP_HEADER_TERMINATOR, HTTP_HEADER_TERMINATOR_LENGTH);
                position += HTTP_HEADER_TERMINATOR_LENGTH;
            }

            result[position] = '\0';
        }
    }

    return result;
}